

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autogenerated_settings.cpp
# Opt level: O2

void duckdb::ExtensionDirectorySetting::SetGlobal
               (DatabaseInstance *db,DBConfig *config,Value *input)

{
  string local_30;
  
  Value::GetValue<std::__cxx11::string>(&local_30,input);
  ::std::__cxx11::string::operator=
            ((string *)&(config->options).extension_directory,(string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void ExtensionDirectorySetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	config.options.extension_directory = input.GetValue<string>();
}